

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfCheckFile.cpp
# Opt level: O2

bool Imf_3_2::anon_unknown_0::readDeepScanLine<Imf_3_2::DeepScanLineInputFile>
               (DeepScanLineInputFile *in,bool reduceMemory,bool reduceTime)

{
  int *piVar1;
  long lVar2;
  Header *pHVar3;
  _Rb_tree_node_base *p_Var4;
  _Rb_tree_node_base *p_Var5;
  uint64_t j;
  int iVar6;
  long lVar7;
  long lVar8;
  int iVar9;
  size_type __new_size;
  long size;
  ulong size_00;
  ulong uVar10;
  bool bVar11;
  Array<unsigned_int> localSampleCount;
  Array<Imf_3_2::Array<void_*>_> data;
  vector<float,_std::allocator<float>_> pixelBuffer;
  DeepFrameBuffer frameBuffer;
  
  Imf_3_2::DeepScanLineInputFile::header();
  piVar1 = (int *)Imf_3_2::Header::dataWindow();
  iVar9 = piVar1[2];
  lVar2 = (long)*piVar1;
  pHVar3 = (Header *)Imf_3_2::DeepScanLineInputFile::header();
  Imf_3_2::calculateBytesPerPixel(pHVar3);
  Imf_3_2::Header::channels();
  p_Var4 = (_Rb_tree_node_base *)Imf_3_2::ChannelList::begin();
  size = (iVar9 - lVar2) + 1;
  size_00 = 0;
  while( true ) {
    Imf_3_2::Header::channels();
    p_Var5 = (_Rb_tree_node_base *)Imf_3_2::ChannelList::end();
    if (p_Var4 == p_Var5) break;
    p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4);
    size_00 = size_00 + 1;
  }
  localSampleCount._size = 0;
  localSampleCount._data = (uint *)0x0;
  Array<unsigned_int>::resizeErase(&localSampleCount,size);
  Array<Imf_3_2::Array<void_*>_>::Array(&data,size_00);
  lVar8 = 0;
  uVar10 = size_00;
  while (bVar11 = uVar10 != 0, uVar10 = uVar10 - 1, bVar11) {
    Array<void_*>::resizeErase((Array<void_*> *)((long)&(data._data)->_size + lVar8),size);
    lVar8 = lVar8 + 0x10;
  }
  DeepFrameBuffer::DeepFrameBuffer(&frameBuffer);
  Imf_3_2::Slice::Slice
            ((Slice *)&pixelBuffer,UINT,(char *)(localSampleCount._data + -lVar2),4,0,1,1,0.0,false,
             false);
  Imf_3_2::DeepFrameBuffer::insertSampleCountSlice((Slice *)&frameBuffer);
  Imf_3_2::Header::channels();
  p_Var4 = (_Rb_tree_node_base *)Imf_3_2::ChannelList::begin();
  lVar8 = 8;
  while( true ) {
    Imf_3_2::Header::channels();
    p_Var5 = (_Rb_tree_node_base *)Imf_3_2::ChannelList::end();
    if (p_Var4 == p_Var5) break;
    Imf_3_2::DeepSlice::DeepSlice
              ((DeepSlice *)&pixelBuffer,FLOAT,
               (char *)(*(long *)((long)&(data._data)->_size + lVar8) + lVar2 * -8),8,0,4,1,1,0.0,
               false,false);
    Imf_3_2::DeepFrameBuffer::insert((char *)&frameBuffer,(DeepSlice *)(p_Var4 + 1));
    p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4);
    lVar8 = lVar8 + 0x10;
  }
  Imf_3_2::DeepScanLineInputFile::setFrameBuffer((DeepFrameBuffer *)in);
  pixelBuffer.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  pixelBuffer.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  pixelBuffer.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  for (iVar9 = piVar1[1]; iVar9 <= piVar1[3]; iVar9 = iVar9 + 1) {
    Imf_3_2::DeepScanLineInputFile::readPixelSampleCounts((int)in);
    __new_size = 0;
    for (lVar2 = 0; lVar2 != size; lVar2 = lVar2 + 1) {
      uVar10 = size_00 & 0xffffffff;
      while (iVar6 = (int)uVar10, uVar10 = (ulong)(iVar6 - 1), iVar6 != 0) {
        __new_size = __new_size + localSampleCount._data[lVar2];
      }
    }
    std::vector<float,_std::allocator<float>_>::resize(&pixelBuffer,__new_size);
    lVar2 = 0;
    for (lVar8 = 0; lVar7 = 8, uVar10 = size_00, lVar8 != size; lVar8 = lVar8 + 1) {
      while (uVar10 != 0) {
        if (localSampleCount._data[lVar8] == 0) {
          *(undefined8 *)(*(long *)((long)&(data._data)->_size + lVar7) + lVar8 * 8) = 0;
        }
        else {
          *(pointer *)(*(long *)((long)&(data._data)->_size + lVar7) + lVar8 * 8) =
               pixelBuffer.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start + lVar2;
          lVar2 = lVar2 + (ulong)localSampleCount._data[lVar8];
        }
        lVar7 = lVar7 + 0x10;
        uVar10 = uVar10 - 1;
      }
    }
    Imf_3_2::DeepScanLineInputFile::readPixels((int)in);
  }
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            (&pixelBuffer.super__Vector_base<float,_std::allocator<float>_>);
  std::
  _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>_>_>
  ::~_Rb_tree((_Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>_>_>
               *)&frameBuffer);
  Array<Imf_3_2::Array<void_*>_>::~Array(&data);
  Array<unsigned_int>::~Array(&localSampleCount);
  return false;
}

Assistant:

bool
readDeepScanLine (T& in, bool reduceMemory, bool reduceTime)
{

    bool threw = false;
    try
    {
        const Header& fileHeader = in.header ();
        const Box2i&  dw         = fileHeader.dataWindow ();

        uint64_t w = static_cast<uint64_t> (dw.max.x) -
                     static_cast<uint64_t> (dw.min.x) + 1;
        int dwx = dw.min.x;

        uint64_t bytesPerSample = calculateBytesPerPixel (in.header ());

        //
        // in reduce memory mode, check size required by sampleCount table
        //
        if (reduceMemory && w * 4 > gMaxBytesPerScanline) { return false; }

        int channelCount = 0;
        for (ChannelList::ConstIterator i = fileHeader.channels ().begin ();
             i != fileHeader.channels ().end ();
             ++i, ++channelCount)
            ;

        Array<unsigned int> localSampleCount;
        localSampleCount.resizeErase (w);
        Array<Array<void*>> data (channelCount);

        for (int i = 0; i < channelCount; i++)
        {
            data[i].resizeErase (w);
        }

        DeepFrameBuffer frameBuffer;

        frameBuffer.insertSampleCountSlice (Slice (
            UINT, (char*) (&localSampleCount[-dwx]), sizeof (unsigned int), 0));

        int channel = 0;
        for (ChannelList::ConstIterator i = fileHeader.channels ().begin ();
             i != fileHeader.channels ().end ();
             ++i, ++channel)
        {
            PixelType type = FLOAT;

            int sampleSize = sizeof (float);

            int pointerSize = sizeof (char*);

            frameBuffer.insert (
                i.name (),
                DeepSlice (
                    type,
                    (char*) (&data[channel][-dwx]),
                    pointerSize,
                    0,
                    sampleSize));
        }

        in.setFrameBuffer (frameBuffer);

        int step = 1;

        vector<float> pixelBuffer;

        for (int y = dw.min.y; y <= dw.max.y; y += step)
        {
            in.readPixelSampleCounts (y);

            //
            // count how many samples are required to store this scanline
            // in reduceMemory mode, pixels with large sample counts are not read,
            // but the library needs to allocate memory for them internally
            // - bufferSize is how much memory this function will allocate
            // - fileBufferSize tracks how much decompressed data the library will require
            //
            size_t bufferSize = 0;
            size_t fileBufferSize = 0;
            for (uint64_t j = 0; j < w; j++)
            {
                for (int k = 0; k < channelCount; k++)
                {
                    fileBufferSize += localSampleCount[j];
                    //
                    // don't read samples which require a lot of memory in reduceMemory mode
                    //

                    if (!reduceMemory || localSampleCount[j] * bytesPerSample <=
                                             gMaxBytesPerDeepPixel)
                    {
                        bufferSize += localSampleCount[j];
                    }
                }
            }

            //
            // limit total number of samples read in reduceMemory mode
            //
            if (!reduceMemory || fileBufferSize + bufferSize < gMaxBytesPerDeepScanline)
            {
                //
                // allocate sample buffer and set per-pixel pointers into buffer
                //
                pixelBuffer.resize (bufferSize);

                size_t bufferIndex = 0;
                for (uint64_t j = 0; j < w; j++)
                {
                    for (int k = 0; k < channelCount; k++)
                    {

                        if (localSampleCount[j] == 0 ||
                            (reduceMemory &&
                             localSampleCount[j] * bytesPerSample >
                                 gMaxBytesPerDeepPixel))
                        {
                            data[k][j] = nullptr;
                        }
                        else
                        {
                            data[k][j] = &pixelBuffer[bufferIndex];
                            bufferIndex += localSampleCount[j];
                        }
                    }
                }

                try
                {
                    in.readPixels (y);
                }
                catch (...)
                {
                    threw = true;
                    //
                    // in reduceTime mode, fail immediately - the file is corrupt
                    //
                    if (reduceTime) { return threw; }
                }
            }
        }
    }
    catch (...)
    {
        threw = true;
    }
    return threw;
}